

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_coletree.c
# Opt level: O0

int find(int i,int *pp)

{
  int local_20;
  int local_1c;
  int gp;
  int p;
  int *pp_local;
  int i_local;
  
  local_1c = pp[i];
  local_20 = pp[local_1c];
  pp_local._4_4_ = i;
  while (local_20 != local_1c) {
    pp[pp_local._4_4_] = local_20;
    pp_local._4_4_ = local_20;
    local_1c = pp[local_20];
    local_20 = pp[local_1c];
  }
  return local_1c;
}

Assistant:

static
int find (
	  int i,
	  int *pp
	  )
{
    register int p, gp;
    
    p = pp[i];
    gp = pp[p];
    while (gp != p) {
	pp[i] = gp;
	i = gp;
	p = pp[i];
	gp = pp[p];
    }
    return (p);
}